

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_cache.cpp
# Opt level: O0

void __thiscall libtorrent::cached_piece_entry::cached_piece_entry(cached_piece_entry *this)

{
  time_point tVar1;
  cached_piece_entry *this_local;
  
  list_node<libtorrent::cached_piece_entry>::list_node
            (&this->super_list_node<libtorrent::cached_piece_entry>);
  boost::intrusive::
  list_base_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>::list_base_hook
            (&this->
              super_list_base_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>
            );
  std::shared_ptr<libtorrent::storage_interface>::shared_ptr(&this->storage);
  tailqueue<libtorrent::disk_io_job>::tailqueue(&this->jobs);
  tailqueue<libtorrent::disk_io_job>::tailqueue(&this->read_jobs);
  std::unique_ptr<libtorrent::partial_hash,std::default_delete<libtorrent::partial_hash>>::
  unique_ptr<std::default_delete<libtorrent::partial_hash>,void>
            ((unique_ptr<libtorrent::partial_hash,std::default_delete<libtorrent::partial_hash>> *)
             &this->hash);
  libtorrent::aux::unique_ptr<libtorrent::cached_block_entry[],_long>::unique_ptr(&this->blocks);
  tVar1 = min_time();
  (this->expire).__d.__r = (rep)tVar1.__d.__r;
  libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
            (&this->piece,0);
  *(ulong *)&this->field_0x7c = *(ulong *)&this->field_0x7c & 0xffffffffffffc000;
  *(ulong *)&this->field_0x7c = *(ulong *)&this->field_0x7c & 0xfffffffff0003fff;
  *(ulong *)&this->field_0x7c = *(ulong *)&this->field_0x7c & 0xffffc000ffffffff;
  *(ulong *)&this->field_0x7c = *(ulong *)&this->field_0x7c & 0xffffbfffffffffff;
  *(ulong *)&this->field_0x7c = *(ulong *)&this->field_0x7c & 0xffff7fffffffffff;
  *(ulong *)&this->field_0x7c = *(ulong *)&this->field_0x7c & 0xfffeffffffffffff;
  *(ulong *)&this->field_0x7c = *(ulong *)&this->field_0x7c & 0xfffdffffffffffff;
  *(ulong *)&this->field_0x7c = *(ulong *)&this->field_0x7c & 0xffe3ffffffffffff;
  *(ulong *)&this->field_0x7c = *(ulong *)&this->field_0x7c & 0xf01fffffffffffff;
  *(ulong *)&this->field_0x7c = *(ulong *)&this->field_0x7c & 0xefffffffffffffff;
  *(ulong *)&this->field_0x7c = *(ulong *)&this->field_0x7c & 0xdfffffffffffffff;
  *(ulong *)&this->field_0x7c = *(ulong *)&this->field_0x7c & 0xbfffffffffffffff;
  *(ushort *)&this->field_0x84 = *(ushort *)&this->field_0x84 & 0x8000;
  this->refcount = 0;
  return;
}

Assistant:

cached_piece_entry::cached_piece_entry()
	: num_dirty(0)
	, num_blocks(0)
	, blocks_in_piece(0)
	, hashing(0)
	, hashing_done(0)
	, marked_for_deletion(false)
	, need_readback(false)
	, cache_state(none)
	, piece_refcount(0)
	, outstanding_flush(0)
	, outstanding_read(0)
	, marked_for_eviction(false)
	, pinned(0)
{}